

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void scale_square_buf_vals(int16_t *dst,int tx_width,int16_t *src,int src_stride)

{
  int idx_2;
  int idy_2;
  int idx_1;
  int idy_1;
  int idx;
  int idy;
  int src_stride_local;
  int16_t *src_local;
  int tx_width_local;
  int16_t *dst_local;
  
  if (tx_width == 4) {
    for (idy = 0; idy < 4; idy = idy + 1) {
      for (idx = 0; idx < 4; idx = idx + 1) {
        dst[idy * 4 + idx] = src[idy * src_stride + idx] << 3;
      }
    }
  }
  else if (tx_width == 8) {
    for (idy_1 = 0; idy_1 < 8; idy_1 = idy_1 + 1) {
      for (idx_1 = 0; idx_1 < 8; idx_1 = idx_1 + 1) {
        dst[idy_1 * 8 + idx_1] = src[idy_1 * src_stride + idx_1] << 3;
      }
    }
  }
  else if (tx_width == 0x10) {
    for (idy_2 = 0; idy_2 < 0x10; idy_2 = idy_2 + 1) {
      for (idx_2 = 0; idx_2 < 0x10; idx_2 = idx_2 + 1) {
        dst[idy_2 * 0x10 + idx_2] = src[idy_2 * src_stride + idx_2] << 3;
      }
    }
  }
  return;
}

Assistant:

static inline void scale_square_buf_vals(int16_t *dst, int tx_width,
                                         const int16_t *src, int src_stride) {
#define DO_SCALING                                                   \
  do {                                                               \
    for (int idy = 0; idy < tx_width; ++idy) {                       \
      for (int idx = 0; idx < tx_width; ++idx) {                     \
        dst[idy * tx_width + idx] = src[idy * src_stride + idx] * 8; \
      }                                                              \
    }                                                                \
  } while (0)

  if (tx_width == 4) {
    DO_SCALING;
  } else if (tx_width == 8) {
    DO_SCALING;
  } else if (tx_width == 16) {
    DO_SCALING;
  } else {
    assert(0);
  }

#undef DO_SCALING
}